

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O0

void __thiscall cmComputeComponentGraph::TarjanVisit(cmComputeComponentGraph *this,size_t i)

{
  value_type vVar1;
  ulong uVar2;
  NodeList *pNVar3;
  EdgeList *pEVar4;
  bool bVar5;
  reference pvVar6;
  reference pvVar7;
  size_t sVar8;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  reference pvVar9;
  iterator __first;
  iterator __last;
  EdgeList *local_60;
  size_t j_1;
  NodeList *component;
  size_t c;
  size_t j;
  cmGraphEdge *ni;
  const_iterator __end1;
  const_iterator __begin1;
  EdgeList *__range1;
  EdgeList *nl;
  size_t i_local;
  cmComputeComponentGraph *this_local;
  
  vVar1 = this->TarjanWalkId;
  nl = (EdgeList *)i;
  i_local = (size_t)this;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->TarjanVisited,i);
  pEVar4 = nl;
  *pvVar6 = vVar1;
  pvVar7 = std::
           vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ::operator[](&this->TarjanEntries,(size_type)nl);
  pvVar7->Root = (size_t)pEVar4;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->TarjanComponents,(size_type)nl);
  *pvVar6 = 0xffffffffffffffff;
  sVar8 = this->TarjanIndex + 1;
  this->TarjanIndex = sVar8;
  pvVar7 = std::
           vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ::operator[](&this->TarjanEntries,(size_type)nl);
  pvVar7->VisitIndex = sVar8;
  std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
            (&this->TarjanStack,(value_type *)&nl);
  this_00 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                       (&this->InputGraph->
                         super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                        (size_type)nl)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  __end1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_00);
  ni = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_00);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                     *)&ni), bVar5) {
    j = (size_t)__gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator*(&__end1);
    c = cmGraphEdge::operator_cast_to_unsigned_long((cmGraphEdge *)j);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->TarjanVisited,c);
    if ((*pvVar6 == 0) ||
       (pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->TarjanVisited,c), this->TarjanWalkId <= *pvVar6)) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->TarjanVisited,c);
      if (*pvVar6 == 0) {
        TarjanVisit(this,c);
      }
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->TarjanComponents,c);
      if (*pvVar6 == 0xffffffffffffffff) {
        pvVar7 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,c);
        pvVar7 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,pvVar7->Root);
        uVar2 = pvVar7->VisitIndex;
        pvVar7 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,(size_type)nl);
        pvVar7 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,pvVar7->Root);
        if (uVar2 < pvVar7->VisitIndex) {
          pvVar7 = std::
                   vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                   ::operator[](&this->TarjanEntries,c);
          sVar8 = pvVar7->Root;
          pvVar7 = std::
                   vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                   ::operator[](&this->TarjanEntries,(size_type)nl);
          pvVar7->Root = sVar8;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
    ::operator++(&__end1);
  }
  pvVar7 = std::
           vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ::operator[](&this->TarjanEntries,(size_type)nl);
  if ((EdgeList *)pvVar7->Root == nl) {
    component = (NodeList *)
                std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size
                          (&this->Components);
    std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::emplace_back<>
              (&this->Components);
    j_1 = (size_t)std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                            (&this->Components,(size_type)component);
    do {
      pvVar9 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::top(&this->TarjanStack);
      local_60 = (EdgeList *)*pvVar9;
      std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                (&this->TarjanStack);
      pNVar3 = component;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->TarjanComponents,(size_type)local_60);
      pEVar4 = nl;
      *pvVar6 = (value_type)pNVar3;
      pvVar7 = std::
               vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
               ::operator[](&this->TarjanEntries,(size_type)local_60);
      pvVar7->Root = (size_t)pEVar4;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)j_1,
                 (value_type_conflict2 *)&local_60);
    } while (local_60 != nl);
    __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)j_1);
    __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)j_1);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__last._M_current);
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TarjanVisit(size_t i)
{
  // We are now visiting this node.
  this->TarjanVisited[i] = this->TarjanWalkId;

  // Initialize the entry.
  this->TarjanEntries[i].Root = i;
  this->TarjanComponents[i] = INVALID_COMPONENT;
  this->TarjanEntries[i].VisitIndex = ++this->TarjanIndex;
  this->TarjanStack.push(i);

  // Follow outgoing edges.
  EdgeList const& nl = this->InputGraph[i];
  for (cmGraphEdge const& ni : nl) {
    size_t j = ni;

    // Ignore edges to nodes that have been reached by a previous DFS
    // walk.  Since we did not reach the current node from that walk
    // it must not belong to the same component and it has already
    // been assigned to a component.
    if (this->TarjanVisited[j] > 0 &&
        this->TarjanVisited[j] < this->TarjanWalkId) {
      continue;
    }

    // Visit the destination if it has not yet been visited.
    if (!this->TarjanVisited[j]) {
      this->TarjanVisit(j);
    }

    // If the destination has not yet been assigned to a component,
    // check if it has a better root for the current object.
    if (this->TarjanComponents[j] == INVALID_COMPONENT) {
      if (this->TarjanEntries[this->TarjanEntries[j].Root].VisitIndex <
          this->TarjanEntries[this->TarjanEntries[i].Root].VisitIndex) {
        this->TarjanEntries[i].Root = this->TarjanEntries[j].Root;
      }
    }
  }

  // Check if we have found a component.
  if (this->TarjanEntries[i].Root == i) {
    // Yes.  Create it.
    size_t c = this->Components.size();
    this->Components.emplace_back();
    NodeList& component = this->Components[c];

    // Populate the component list.
    size_t j;
    do {
      // Get the next member of the component.
      j = this->TarjanStack.top();
      this->TarjanStack.pop();

      // Assign the member to the component.
      this->TarjanComponents[j] = c;
      this->TarjanEntries[j].Root = i;

      // Store the node in its component.
      component.push_back(j);
    } while (j != i);

    // Sort the component members for clarity.
    std::sort(component.begin(), component.end());
  }
}